

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>
                   (string *__return_storage_ptr__,char (*a) [30],bool *b,char (*args) [2],
                   char (*args_1) [42],bool *args_2,char (*args_3) [2],char (*args_4) [43],
                   bool *args_5,char (*args_6) [2],char (*args_7) [37],bool *args_8,
                   char (*args_9) [2],char (*args_10) [34],bool *args_11,char (*args_12) [2])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_4f8;
  cmAlphaNum local_4c0;
  cmAlphaNum local_488;
  cmAlphaNum local_450;
  cmAlphaNum local_418;
  cmAlphaNum local_3e0;
  cmAlphaNum local_3a8;
  cmAlphaNum local_370;
  cmAlphaNum local_338;
  cmAlphaNum local_300;
  cmAlphaNum local_2c8;
  cmAlphaNum local_290;
  cmAlphaNum local_258;
  cmAlphaNum local_220;
  cmAlphaNum local_1e8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_1b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_198;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_180;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_168;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_150;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_138;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_120;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_108;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  bool *local_38;
  bool *args_local_2;
  char (*args_local_1) [42];
  char (*args_local) [2];
  bool *b_local;
  char (*a_local) [30];
  
  local_38 = args_2;
  args_local_2 = (bool *)args_1;
  args_local_1 = (char (*) [42])args;
  args_local = (char (*) [2])b;
  b_local = (bool *)a;
  a_local = (char (*) [30])__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_1e8,*a);
  cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const(&)[30],bool&&,char_const(&)[2],char_const(&)[42],bool&&,char_const(&)[2],char_const(&)[43],bool&&,char_const(&)[2],char_const(&)[37],bool&&,char_const(&)[2],char_const(&)[34],bool&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_1b0,
             &cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[])
              ::makePair,&local_1e8);
  cmAlphaNum::cmAlphaNum(&local_220,(uint)((*args_local)[0] & 1));
  cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const(&)[30],bool&&,char_const(&)[2],char_const(&)[42],bool&&,char_const(&)[2],char_const(&)[43],bool&&,char_const(&)[2],char_const(&)[37],bool&&,char_const(&)[2],char_const(&)[34],bool&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_198,
             &cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[])
              ::makePair,&local_220);
  cmAlphaNum::cmAlphaNum(&local_258,*args_local_1);
  cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const(&)[30],bool&&,char_const(&)[2],char_const(&)[42],bool&&,char_const(&)[2],char_const(&)[43],bool&&,char_const(&)[2],char_const(&)[37],bool&&,char_const(&)[2],char_const(&)[34],bool&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_180,
             &cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[])
              ::makePair,&local_258);
  cmAlphaNum::cmAlphaNum(&local_290,args_local_2);
  cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const(&)[30],bool&&,char_const(&)[2],char_const(&)[42],bool&&,char_const(&)[2],char_const(&)[43],bool&&,char_const(&)[2],char_const(&)[37],bool&&,char_const(&)[2],char_const(&)[34],bool&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_168,
             &cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[])
              ::makePair,&local_290);
  cmAlphaNum::cmAlphaNum(&local_2c8,(uint)(*local_38 & 1));
  cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const(&)[30],bool&&,char_const(&)[2],char_const(&)[42],bool&&,char_const(&)[2],char_const(&)[43],bool&&,char_const(&)[2],char_const(&)[37],bool&&,char_const(&)[2],char_const(&)[34],bool&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_150,
             &cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[])
              ::makePair,&local_2c8);
  cmAlphaNum::cmAlphaNum(&local_300,*args_3);
  cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const(&)[30],bool&&,char_const(&)[2],char_const(&)[42],bool&&,char_const(&)[2],char_const(&)[43],bool&&,char_const(&)[2],char_const(&)[37],bool&&,char_const(&)[2],char_const(&)[34],bool&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_138,
             &cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[])
              ::makePair,&local_300);
  cmAlphaNum::cmAlphaNum(&local_338,*args_4);
  cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const(&)[30],bool&&,char_const(&)[2],char_const(&)[42],bool&&,char_const(&)[2],char_const(&)[43],bool&&,char_const(&)[2],char_const(&)[37],bool&&,char_const(&)[2],char_const(&)[34],bool&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_120,
             &cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[])
              ::makePair,&local_338);
  cmAlphaNum::cmAlphaNum(&local_370,(uint)(*args_5 & 1));
  cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const(&)[30],bool&&,char_const(&)[2],char_const(&)[42],bool&&,char_const(&)[2],char_const(&)[43],bool&&,char_const(&)[2],char_const(&)[37],bool&&,char_const(&)[2],char_const(&)[34],bool&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_108,
             &cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[])
              ::makePair,&local_370);
  cmAlphaNum::cmAlphaNum(&local_3a8,*args_6);
  cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const(&)[30],bool&&,char_const(&)[2],char_const(&)[42],bool&&,char_const(&)[2],char_const(&)[43],bool&&,char_const(&)[2],char_const(&)[37],bool&&,char_const(&)[2],char_const(&)[34],bool&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_f0,
             &cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[])
              ::makePair,&local_3a8);
  cmAlphaNum::cmAlphaNum(&local_3e0,*args_7);
  cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const(&)[30],bool&&,char_const(&)[2],char_const(&)[42],bool&&,char_const(&)[2],char_const(&)[43],bool&&,char_const(&)[2],char_const(&)[37],bool&&,char_const(&)[2],char_const(&)[34],bool&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_d8,
             &cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[])
              ::makePair,&local_3e0);
  cmAlphaNum::cmAlphaNum(&local_418,(uint)(*args_8 & 1));
  cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const(&)[30],bool&&,char_const(&)[2],char_const(&)[42],bool&&,char_const(&)[2],char_const(&)[43],bool&&,char_const(&)[2],char_const(&)[37],bool&&,char_const(&)[2],char_const(&)[34],bool&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_c0,
             &cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[])
              ::makePair,&local_418);
  cmAlphaNum::cmAlphaNum(&local_450,*args_9);
  cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const(&)[30],bool&&,char_const(&)[2],char_const(&)[42],bool&&,char_const(&)[2],char_const(&)[43],bool&&,char_const(&)[2],char_const(&)[37],bool&&,char_const(&)[2],char_const(&)[34],bool&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[])
              ::makePair,&local_450);
  cmAlphaNum::cmAlphaNum(&local_488,*args_10);
  cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const(&)[30],bool&&,char_const(&)[2],char_const(&)[42],bool&&,char_const(&)[2],char_const(&)[43],bool&&,char_const(&)[2],char_const(&)[37],bool&&,char_const(&)[2],char_const(&)[34],bool&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[])
              ::makePair,&local_488);
  cmAlphaNum::cmAlphaNum(&local_4c0,(uint)(*args_11 & 1));
  cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const(&)[30],bool&&,char_const(&)[2],char_const(&)[42],bool&&,char_const(&)[2],char_const(&)[43],bool&&,char_const(&)[2],char_const(&)[37],bool&&,char_const(&)[2],char_const(&)[34],bool&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[])
              ::makePair,&local_4c0);
  cmAlphaNum::cmAlphaNum(&local_4f8,*args_12);
  cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const(&)[30],bool&&,char_const(&)[2],char_const(&)[42],bool&&,char_const(&)[2],char_const(&)[43],bool&&,char_const(&)[2],char_const(&)[37],bool&&,char_const(&)[2],char_const(&)[34],bool&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>(char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[],char_const&[],bool&&,char_const&[])
              ::makePair,&local_4f8);
  local_48 = &local_1b0;
  local_40 = 0xf;
  views._M_len = 0xf;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}